

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathCacheConvertBoolean(xmlXPathContextPtr ctxt,xmlXPathObjectPtr val)

{
  int val_00;
  xmlXPathObjectPtr ret;
  xmlXPathObjectPtr val_local;
  xmlXPathContextPtr ctxt_local;
  
  if (val == (xmlXPathObjectPtr)0x0) {
    ctxt_local = (xmlXPathContextPtr)xmlXPathCacheNewBoolean(ctxt,0);
  }
  else {
    ctxt_local = (xmlXPathContextPtr)val;
    if (val->type != XPATH_BOOLEAN) {
      val_00 = xmlXPathCastToBoolean(val);
      ctxt_local = (xmlXPathContextPtr)xmlXPathCacheNewBoolean(ctxt,val_00);
      xmlXPathReleaseObject(ctxt,val);
    }
  }
  return (xmlXPathObjectPtr)ctxt_local;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheConvertBoolean(xmlXPathContextPtr ctxt, xmlXPathObjectPtr val) {
    xmlXPathObjectPtr ret;

    if (val == NULL)
	return(xmlXPathCacheNewBoolean(ctxt, 0));
    if (val->type == XPATH_BOOLEAN)
	return(val);
    ret = xmlXPathCacheNewBoolean(ctxt, xmlXPathCastToBoolean(val));
    xmlXPathReleaseObject(ctxt, val);
    return(ret);
}